

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

bool Js::VarIsImpl<Js::JavascriptPromiseThunkFinallyFunction>(RecyclableObject *obj)

{
  bool bVar1;
  undefined1 local_19;
  RecyclableObject *obj_local;
  
  bVar1 = VarIs<Js::JavascriptFunction,Js::RecyclableObject>(obj);
  if (bVar1) {
    bVar1 = VirtualTableInfo<Js::JavascriptPromiseThunkFinallyFunction>::HasVirtualTable(obj);
    local_19 = true;
    if (!bVar1) {
      local_19 = VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptPromiseThunkFinallyFunction>_>::
                 HasVirtualTable(obj);
    }
    obj_local._7_1_ = local_19;
  }
  else {
    obj_local._7_1_ = false;
  }
  return obj_local._7_1_;
}

Assistant:

bool VarIsImpl<JavascriptPromiseThunkFinallyFunction>(RecyclableObject* obj)
    {
        if (VarIs<JavascriptFunction>(obj))
        {
            return VirtualTableInfo<JavascriptPromiseThunkFinallyFunction>::HasVirtualTable(obj)
                || VirtualTableInfo<CrossSiteObject<JavascriptPromiseThunkFinallyFunction>>::HasVirtualTable(obj);
        }
        return false;
    }